

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.cpp
# Opt level: O3

void __thiscall FIX::message_order::message_order(message_order *this,int first,...)

{
  char in_AL;
  ulong uVar1;
  int *piVar2;
  int iVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  void **ppvVar4;
  uint uVar5;
  void **ppvVar6;
  int iVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t sVar8;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arguments;
  void **local_110;
  shared_array<int> local_f8;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  this->m_mode = group;
  (this->m_groupOrder).m_size = 0;
  (this->m_groupOrder).m_buffer = (int *)0x0;
  this->m_delim = first;
  this->m_largest = first;
  ppvVar4 = &arguments[0].overflow_arg_area;
  if (first != 0) {
    uVar1 = 0x10;
    iVar3 = this->m_largest;
    iVar7 = first;
    do {
      if (iVar7 < iVar3) {
        iVar7 = iVar3;
      }
      iVar3 = iVar7;
      this->m_largest = iVar3;
      if ((uint)uVar1 < 0x29) {
        ppvVar6 = (void **)((long)local_e8 + uVar1);
        uVar1 = (ulong)((uint)uVar1 + 8);
      }
      else {
        ppvVar6 = ppvVar4;
        ppvVar4 = ppvVar4 + 1;
      }
      iVar7 = *(int *)ppvVar6;
    } while (iVar7 != 0);
    if (first != 0) {
      sVar8 = (long)this->m_largest + 1;
      local_e8[2] = (void *)in_RDX;
      local_e8[3] = (void *)in_RCX;
      local_c8 = in_R8;
      local_c0 = in_R9;
      if ((int)sVar8 == 0) {
        local_f8.m_size = 0;
        local_f8.m_buffer = (int *)0x0;
      }
      else {
        uVar1 = sVar8 * 4 + 8;
        piVar2 = (int *)operator_new__(-(ulong)((long)this->m_largest + 3U >> 0x3e != 0) | uVar1);
        memset(piVar2,0,uVar1);
        *piVar2 = 1;
        local_f8.m_size = sVar8;
        local_f8.m_buffer = piVar2;
      }
      local_110 = &arguments[0].overflow_arg_area;
      shared_array<int>::operator=(&this->m_groupOrder,&local_f8);
      shared_array<int>::release(&local_f8);
      uVar5 = 0x10;
      piVar2 = (this->m_groupOrder).m_buffer;
      iVar3 = 1;
      do {
        piVar2[(long)first + 2] = iVar3;
        uVar1 = (ulong)uVar5;
        if (uVar1 < 0x29) {
          uVar5 = uVar5 + 8;
          ppvVar4 = (void **)((long)local_e8 + uVar1);
        }
        else {
          ppvVar4 = local_110;
          local_110 = local_110 + 1;
        }
        first = *(int *)ppvVar4;
        iVar3 = iVar3 + 1;
      } while (first != 0);
      return;
    }
  }
  this->m_largest = 0;
  this->m_delim = 0;
  return;
}

Assistant:

message_order::message_order( int first, ... )
: m_mode( group ), m_delim( 0 ), m_largest( 0 )
{
  int field = first;
  int size = 0;
  m_largest = m_delim = first;

  va_list arguments;
  va_start( arguments, first );
  while( field != 0 )
  {
      m_largest = m_largest > field ? m_largest : field;
      
      size++;
      field = va_arg( arguments, int );
  }

  if(size)
  {
      m_groupOrder = shared_array<int>::create(m_largest + 1);

      va_start( arguments, first );
      field = first;
      int i = 0;
      while( field != 0 )
      {
          m_groupOrder[ field ] = ++i;
          field = va_arg( arguments, int );
      }
  }
  else
  {
      m_largest = 0;
      m_delim = 0;
  }

  va_end( arguments );
}